

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICMakeFiles.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_10404de::CMakeFiles::DumpGlobDependent
          (Value *__return_storage_ptr__,CMakeFiles *this,cmGlobCacheEntry *entry)

{
  bool bVar1;
  Value *pVVar2;
  ulong uVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  Value local_170;
  reference local_148;
  string *file;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  Value paths;
  Value local_d8;
  Value local_b0;
  Value local_88;
  Value local_50;
  byte local_21;
  cmGlobCacheEntry *local_20;
  cmGlobCacheEntry *entry_local;
  CMakeFiles *this_local;
  Value *globDependent;
  
  local_21 = 0;
  local_20 = entry;
  entry_local = (cmGlobCacheEntry *)this;
  this_local = (CMakeFiles *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_50,&local_20->Expression);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"expression");
  Json::Value::operator=(pVVar2,&local_50);
  Json::Value::~Value(&local_50);
  if ((local_20->Recurse & 1U) != 0) {
    Json::Value::Value(&local_88,true);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"recurse");
    Json::Value::operator=(pVVar2,&local_88);
    Json::Value::~Value(&local_88);
  }
  if ((local_20->ListDirectories & 1U) != 0) {
    Json::Value::Value(&local_b0,true);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"listDirectories");
    Json::Value::operator=(pVVar2,&local_b0);
    Json::Value::~Value(&local_b0);
  }
  if ((local_20->FollowSymlinks & 1U) != 0) {
    Json::Value::Value(&local_d8,true);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"followSymlinks");
    Json::Value::operator=(pVVar2,&local_d8);
    Json::Value::~Value(&local_d8);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    Json::Value::Value((Value *)&paths.limit_,&local_20->Relative);
    pVVar2 = Json::Value::operator[](__return_storage_ptr__,"relative");
    Json::Value::operator=(pVVar2,(Value *)&paths.limit_);
    Json::Value::~Value((Value *)&paths.limit_);
  }
  Json::Value::Value((Value *)&__range1,arrayValue);
  this_00 = &local_20->Files;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  file = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&file);
    if (!bVar1) break;
    local_148 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    Json::Value::Value(&local_170,local_148);
    Json::Value::append((Value *)&__range1,&local_170);
    Json::Value::~Value(&local_170);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"paths");
  Json::Value::operator=(pVVar2,(Value *)&__range1);
  local_21 = 1;
  Json::Value::~Value((Value *)&__range1);
  if ((local_21 & 1) == 0) {
    Json::Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value CMakeFiles::DumpGlobDependent(cmGlobCacheEntry const& entry)
{
  Json::Value globDependent = Json::objectValue;
  globDependent["expression"] = entry.Expression;
  if (entry.Recurse) {
    globDependent["recurse"] = true;
  }
  if (entry.ListDirectories) {
    globDependent["listDirectories"] = true;
  }
  if (entry.FollowSymlinks) {
    globDependent["followSymlinks"] = true;
  }
  if (!entry.Relative.empty()) {
    globDependent["relative"] = entry.Relative;
  }
  Json::Value paths = Json::arrayValue;
  for (std::string const& file : entry.Files) {
    paths.append(file);
  }
  globDependent["paths"] = std::move(paths);
  return globDependent;
}